

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O3

void base64_stream_encode_avx2(base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  byte bVar1;
  undefined1 auVar2 [32];
  undefined1 *puVar3;
  size_t sVar4;
  ulong uVar5;
  undefined1 (*pauVar6) [32];
  byte bVar7;
  uint uVar8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  
  uVar8 = state->bytes;
  sVar4 = 0;
  bVar7 = state->carry;
  if ((ulong)uVar8 == 2) goto LAB_0010736c;
  if (uVar8 == 1) goto LAB_00107332;
  uVar5 = (ulong)uVar8;
  if (uVar8 == 0) {
    do {
      sVar4 = uVar5;
      if (0x1f < srclen) {
        uVar5 = (srclen - 4) / 0x18;
        srclen = srclen + uVar5 * -0x18;
        sVar4 = uVar5 * 0x20 + sVar4;
        auVar10 = vpermq_avx2(*(undefined1 (*) [32])src,0x94);
        auVar13 = vpshufb_avx2(auVar10,_DAT_0010b420);
        auVar10 = vpand_avx2(auVar13,_DAT_0010b440);
        auVar14 = vpmulhuw_avx2(auVar10,_DAT_0010b460);
        auVar10 = vpand_avx2(auVar13,_DAT_0010b480);
        auVar13 = vpsllw_avx2(auVar10,8);
        auVar10 = vpsllw_avx2(auVar10,4);
        auVar10 = vpblendw_avx2(auVar10,auVar13,0xaa);
        auVar14 = vpor_avx2(auVar10,auVar14);
        auVar11[8] = 0x33;
        auVar11._0_8_ = 0x3333333333333333;
        auVar11[9] = 0x33;
        auVar11[10] = 0x33;
        auVar11[0xb] = 0x33;
        auVar11[0xc] = 0x33;
        auVar11[0xd] = 0x33;
        auVar11[0xe] = 0x33;
        auVar11[0xf] = 0x33;
        auVar11[0x10] = 0x33;
        auVar11[0x11] = 0x33;
        auVar11[0x12] = 0x33;
        auVar11[0x13] = 0x33;
        auVar11[0x14] = 0x33;
        auVar11[0x15] = 0x33;
        auVar11[0x16] = 0x33;
        auVar11[0x17] = 0x33;
        auVar11[0x18] = 0x33;
        auVar11[0x19] = 0x33;
        auVar11[0x1a] = 0x33;
        auVar11[0x1b] = 0x33;
        auVar11[0x1c] = 0x33;
        auVar11[0x1d] = 0x33;
        auVar11[0x1e] = 0x33;
        auVar11[0x1f] = 0x33;
        auVar13 = vpsubusb_avx2(auVar14,auVar11);
        auVar12[8] = 0x19;
        auVar12._0_8_ = 0x1919191919191919;
        auVar12[9] = 0x19;
        auVar12[10] = 0x19;
        auVar12[0xb] = 0x19;
        auVar12[0xc] = 0x19;
        auVar12[0xd] = 0x19;
        auVar12[0xe] = 0x19;
        auVar12[0xf] = 0x19;
        auVar12[0x10] = 0x19;
        auVar12[0x11] = 0x19;
        auVar12[0x12] = 0x19;
        auVar12[0x13] = 0x19;
        auVar12[0x14] = 0x19;
        auVar12[0x15] = 0x19;
        auVar12[0x16] = 0x19;
        auVar12[0x17] = 0x19;
        auVar12[0x18] = 0x19;
        auVar12[0x19] = 0x19;
        auVar12[0x1a] = 0x19;
        auVar12[0x1b] = 0x19;
        auVar12[0x1c] = 0x19;
        auVar12[0x1d] = 0x19;
        auVar12[0x1e] = 0x19;
        auVar12[0x1f] = 0x19;
        auVar10 = vpcmpgtb_avx2(auVar14,auVar12);
        auVar10 = vpsubb_avx2(auVar13,auVar10);
        auVar13._16_16_ = _DAT_0010b310;
        auVar13._0_16_ = _DAT_0010b310;
        auVar10 = vpshufb_avx2(auVar13,auVar10);
        auVar10 = vpaddb_avx2(auVar10,auVar14);
        *(undefined1 (*) [32])out = auVar10;
        auVar10 = _DAT_0010b4c0;
        pauVar6 = (undefined1 (*) [32])(*(undefined1 (*) [32])src + 0x14);
        out = (char *)((long)out + 0x20);
        uVar5 = uVar5 - 1;
        if (uVar5 != 0) {
          auVar14._8_4_ = 0xfc0fc00;
          auVar14._0_8_ = 0xfc0fc000fc0fc00;
          auVar14._12_4_ = 0xfc0fc00;
          auVar14._16_4_ = 0xfc0fc00;
          auVar14._20_4_ = 0xfc0fc00;
          auVar14._24_4_ = 0xfc0fc00;
          auVar14._28_4_ = 0xfc0fc00;
          auVar15._8_4_ = 0x4000040;
          auVar15._0_8_ = 0x400004004000040;
          auVar15._12_4_ = 0x4000040;
          auVar15._16_4_ = 0x4000040;
          auVar15._20_4_ = 0x4000040;
          auVar15._24_4_ = 0x4000040;
          auVar15._28_4_ = 0x4000040;
          auVar16._8_4_ = 0x3f03f0;
          auVar16._0_8_ = 0x3f03f0003f03f0;
          auVar16._12_4_ = 0x3f03f0;
          auVar16._16_4_ = 0x3f03f0;
          auVar16._20_4_ = 0x3f03f0;
          auVar16._24_4_ = 0x3f03f0;
          auVar16._28_4_ = 0x3f03f0;
          do {
            if (uVar5 < 8) {
              lVar9 = -4;
              if (3 < uVar5) goto LAB_00107163;
              lVar9 = -2;
              if (uVar5 == 1) {
                auVar15 = vpshufb_avx2(*pauVar6,_DAT_0010b4c0);
                auVar10 = vpand_avx2(auVar15,_DAT_0010b440);
                auVar14 = vpmulhuw_avx2(auVar10,_DAT_0010b460);
                auVar10 = vpand_avx2(auVar15,_DAT_0010b480);
                auVar15 = vpsllw_avx2(auVar10,8);
                auVar10 = vpsllw_avx2(auVar10,4);
                auVar10 = vpblendw_avx2(auVar10,auVar15,0xaa);
                auVar14 = vpor_avx2(auVar10,auVar14);
                auVar11 = vpsubusb_avx2(auVar14,auVar11);
                auVar10 = vpcmpgtb_avx2(auVar14,auVar12);
                auVar10 = vpsubb_avx2(auVar11,auVar10);
                auVar10 = vpshufb_avx2(auVar13,auVar10);
                auVar10 = vpaddb_avx2(auVar10,auVar14);
                *(undefined1 (*) [32])out = auVar10;
                pauVar6 = (undefined1 (*) [32])(*pauVar6 + 0x18);
                out = (char *)((long)out + 0x20);
                break;
              }
            }
            else {
              auVar18 = vpshufb_avx2(*pauVar6,auVar10);
              auVar17 = vpand_avx2(auVar18,auVar14);
              auVar2 = vpmulhuw_avx2(auVar17,auVar15);
              auVar17 = vpand_avx2(auVar18,auVar16);
              auVar18 = vpsllw_avx2(auVar17,8);
              auVar17 = vpsllw_avx2(auVar17,4);
              auVar17 = vpblendw_avx2(auVar17,auVar18,0xaa);
              auVar2 = vpor_avx2(auVar2,auVar17);
              auVar18 = vpsubusb_avx2(auVar2,auVar11);
              auVar17 = vpcmpgtb_avx2(auVar2,auVar12);
              auVar17 = vpsubb_avx2(auVar18,auVar17);
              auVar17 = vpshufb_avx2(auVar13,auVar17);
              auVar17 = vpaddb_avx2(auVar17,auVar2);
              *(undefined1 (*) [32])out = auVar17;
              auVar18 = vpshufb_avx2(*(undefined1 (*) [32])(*pauVar6 + 0x18),auVar10);
              auVar17 = vpand_avx2(auVar18,auVar14);
              auVar2 = vpmulhuw_avx2(auVar17,auVar15);
              auVar17 = vpand_avx2(auVar18,auVar16);
              auVar18 = vpsllw_avx2(auVar17,8);
              auVar17 = vpsllw_avx2(auVar17,4);
              auVar17 = vpblendw_avx2(auVar17,auVar18,0xaa);
              auVar2 = vpor_avx2(auVar2,auVar17);
              auVar18 = vpsubusb_avx2(auVar2,auVar11);
              auVar17 = vpcmpgtb_avx2(auVar2,auVar12);
              auVar17 = vpsubb_avx2(auVar18,auVar17);
              auVar17 = vpshufb_avx2(auVar13,auVar17);
              auVar17 = vpaddb_avx2(auVar17,auVar2);
              *(undefined1 (*) [32])((long)out + 0x20) = auVar17;
              auVar18 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[1] + 0x10),auVar10);
              auVar17 = vpand_avx2(auVar18,auVar14);
              auVar2 = vpmulhuw_avx2(auVar17,auVar15);
              auVar17 = vpand_avx2(auVar18,auVar16);
              auVar18 = vpsllw_avx2(auVar17,8);
              auVar17 = vpsllw_avx2(auVar17,4);
              auVar17 = vpblendw_avx2(auVar17,auVar18,0xaa);
              auVar2 = vpor_avx2(auVar2,auVar17);
              auVar18 = vpsubusb_avx2(auVar2,auVar11);
              auVar17 = vpcmpgtb_avx2(auVar2,auVar12);
              auVar17 = vpsubb_avx2(auVar18,auVar17);
              auVar17 = vpshufb_avx2(auVar13,auVar17);
              auVar17 = vpaddb_avx2(auVar17,auVar2);
              *(undefined1 (*) [32])((long)out + 0x40) = auVar17;
              auVar18 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar6[2] + 8),auVar10);
              auVar17 = vpand_avx2(auVar18,auVar14);
              auVar2 = vpmulhuw_avx2(auVar17,auVar15);
              auVar17 = vpand_avx2(auVar18,auVar16);
              auVar18 = vpsllw_avx2(auVar17,8);
              auVar17 = vpsllw_avx2(auVar17,4);
              auVar17 = vpblendw_avx2(auVar17,auVar18,0xaa);
              auVar2 = vpor_avx2(auVar2,auVar17);
              auVar18 = vpsubusb_avx2(auVar2,auVar11);
              auVar17 = vpcmpgtb_avx2(auVar2,auVar12);
              auVar17 = vpsubb_avx2(auVar18,auVar17);
              auVar17 = vpshufb_avx2(auVar13,auVar17);
              auVar17 = vpaddb_avx2(auVar17,auVar2);
              *(undefined1 (*) [32])((long)out + 0x60) = auVar17;
              pauVar6 = pauVar6 + 3;
              out = (char *)((long)out + 0x80);
              lVar9 = -8;
LAB_00107163:
              auVar18 = vpshufb_avx2(*pauVar6,auVar10);
              auVar17 = vpand_avx2(auVar18,auVar14);
              auVar2 = vpmulhuw_avx2(auVar17,auVar15);
              auVar17 = vpand_avx2(auVar18,auVar16);
              auVar18 = vpsllw_avx2(auVar17,8);
              auVar17 = vpsllw_avx2(auVar17,4);
              auVar17 = vpblendw_avx2(auVar17,auVar18,0xaa);
              auVar2 = vpor_avx2(auVar2,auVar17);
              auVar18 = vpsubusb_avx2(auVar2,auVar11);
              auVar17 = vpcmpgtb_avx2(auVar2,auVar12);
              auVar17 = vpsubb_avx2(auVar18,auVar17);
              auVar17 = vpshufb_avx2(auVar13,auVar17);
              auVar17 = vpaddb_avx2(auVar17,auVar2);
              *(undefined1 (*) [32])out = auVar17;
              auVar18 = vpshufb_avx2(*(undefined1 (*) [32])(*pauVar6 + 0x18),auVar10);
              auVar17 = vpand_avx2(auVar18,auVar14);
              auVar2 = vpmulhuw_avx2(auVar17,auVar15);
              auVar17 = vpand_avx2(auVar18,auVar16);
              auVar18 = vpsllw_avx2(auVar17,8);
              auVar17 = vpsllw_avx2(auVar17,4);
              auVar17 = vpblendw_avx2(auVar17,auVar18,0xaa);
              auVar2 = vpor_avx2(auVar2,auVar17);
              auVar18 = vpsubusb_avx2(auVar2,auVar11);
              auVar17 = vpcmpgtb_avx2(auVar2,auVar12);
              auVar17 = vpsubb_avx2(auVar18,auVar17);
              auVar17 = vpshufb_avx2(auVar13,auVar17);
              auVar17 = vpaddb_avx2(auVar17,auVar2);
              *(undefined1 (*) [32])((long)out + 0x20) = auVar17;
              pauVar6 = (undefined1 (*) [32])(pauVar6[1] + 0x10);
              out = (char *)((long)out + 0x40);
            }
            auVar18 = vpshufb_avx2(*pauVar6,auVar10);
            auVar17 = vpand_avx2(auVar18,auVar14);
            auVar2 = vpmulhuw_avx2(auVar17,auVar15);
            auVar17 = vpand_avx2(auVar18,auVar16);
            auVar18 = vpsllw_avx2(auVar17,8);
            auVar17 = vpsllw_avx2(auVar17,4);
            auVar17 = vpblendw_avx2(auVar17,auVar18,0xaa);
            auVar2 = vpor_avx2(auVar2,auVar17);
            auVar18 = vpsubusb_avx2(auVar2,auVar11);
            auVar17 = vpcmpgtb_avx2(auVar2,auVar12);
            auVar17 = vpsubb_avx2(auVar18,auVar17);
            auVar17 = vpshufb_avx2(auVar13,auVar17);
            auVar17 = vpaddb_avx2(auVar17,auVar2);
            *(undefined1 (*) [32])out = auVar17;
            auVar18 = vpshufb_avx2(*(undefined1 (*) [32])(*pauVar6 + 0x18),auVar10);
            auVar17 = vpand_avx2(auVar18,auVar14);
            auVar2 = vpmulhuw_avx2(auVar17,auVar15);
            auVar17 = vpand_avx2(auVar18,auVar16);
            auVar18 = vpsllw_avx2(auVar17,8);
            auVar17 = vpsllw_avx2(auVar17,4);
            auVar17 = vpblendw_avx2(auVar17,auVar18,0xaa);
            auVar2 = vpor_avx2(auVar2,auVar17);
            auVar18 = vpsubusb_avx2(auVar2,auVar11);
            auVar17 = vpcmpgtb_avx2(auVar2,auVar12);
            auVar17 = vpsubb_avx2(auVar18,auVar17);
            auVar17 = vpshufb_avx2(auVar13,auVar17);
            auVar17 = vpaddb_avx2(auVar17,auVar2);
            *(undefined1 (*) [32])((long)out + 0x20) = auVar17;
            pauVar6 = (undefined1 (*) [32])(pauVar6[1] + 0x10);
            out = (char *)((long)out + 0x40);
            uVar5 = uVar5 + lVar9;
          } while (uVar5 != 0);
        }
        src = *pauVar6 + 4;
      }
      if (srclen == 0) {
        uVar8 = 0;
        break;
      }
      srclen = srclen - 1;
      (*(undefined1 (*) [32])out)[0] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(byte)(*(undefined1 (*) [32])src)[0] >> 2];
      out = *(undefined1 (*) [32])out + 1;
      puVar3 = *(undefined1 (*) [32])src;
      src = *(undefined1 (*) [32])src + 1;
      bVar7 = (*puVar3 & 3) << 4;
      sVar4 = sVar4 + 1;
LAB_00107332:
      if (srclen == 0) {
        uVar8 = 1;
        break;
      }
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar7 | (byte)*src >> 4)];
      out = (char *)((uint8_t *)out + 1);
      bVar7 = *src;
      src = (char *)((byte *)src + 1);
      bVar7 = (bVar7 & 0xf) << 2;
      sVar4 = sVar4 + 1;
LAB_0010736c:
      if (srclen == 0) goto LAB_001073b1;
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar7 | (byte)*src >> 6)];
      bVar1 = *src;
      src = (char *)((byte *)src + 1);
      ((uint8_t *)out)[1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 & 0x3f];
      out = (char *)((uint8_t *)out + 2);
      uVar5 = sVar4 + 2;
    } while( true );
  }
LAB_001073c4:
  state->bytes = uVar8;
  state->carry = bVar7;
  *outlen = sVar4;
  return;
LAB_001073b1:
  uVar8 = 2;
  goto LAB_001073c4;
}

Assistant:

BASE64_ENC_FUNCTION(avx2)
{
#if HAVE_AVX2
	#include "../generic/enc_head.c"
	enc_loop_avx2(&s, &slen, &o, &olen);
	#include "../generic/enc_tail.c"
#else
	BASE64_ENC_STUB
#endif
}